

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeStringOps.cpp
# Opt level: O3

time_units gmlc::utilities::timeUnitsFromString(string_view unitString)

{
  const_iterator cVar1;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  time_units tVar5;
  char *in_RSI;
  size_t in_RDI;
  string_view sVar6;
  string_view trimCharacters;
  string_view input;
  string lcUstring;
  key_type local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  key_type local_b0;
  size_type local_a0;
  undefined8 uStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e0._M_len = in_RDI;
  local_e0._M_str = in_RSI;
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
                  *)time_unitstrings,&local_e0);
  if (cVar1._M_node == (_Base_ptr)(time_unitstrings + 8)) {
    sVar6._M_str = local_e0._M_str;
    sVar6._M_len = local_e0._M_len;
    trimCharacters._M_str = " \t\n\r";
    trimCharacters._M_len = 4;
    pcVar3 = " \t\n\r";
    sVar6 = string_viewOps::trim(sVar6,trimCharacters);
    input._M_len = sVar6._M_str;
    input._M_str = pcVar3;
    convertToLowerCase_abi_cxx11_(&local_70,(utilities *)sVar6._M_len,input);
    local_b0._M_len = local_70._M_string_length;
    local_b0._M_str = local_70._M_dataplus._M_p;
    cVar1 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
            ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_time_units>_>_>
                    *)time_unitstrings,&local_b0);
    if (cVar1._M_node == (_Base_ptr)(time_unitstrings + 8)) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"unit ","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,local_e0._M_str,local_e0._M_str + local_e0._M_len);
      std::operator+(&local_50,&local_d0,&local_90);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50," not recognized");
      local_b0._M_len = (size_t)(pbVar2->_M_dataplus)._M_p;
      paVar4 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_len == paVar4) {
        local_a0 = paVar4->_M_allocated_capacity;
        uStack_98 = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_b0._M_len = (size_t)&local_a0;
      }
      else {
        local_a0 = paVar4->_M_allocated_capacity;
      }
      local_b0._M_str = (char *)pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      std::invalid_argument::invalid_argument(this,(string *)&local_b0);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    tVar5 = *(time_units *)&cVar1._M_node[1]._M_left;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    tVar5 = *(time_units *)&cVar1._M_node[1]._M_left;
  }
  return tVar5;
}

Assistant:

time_units timeUnitsFromString(std::string_view unitString)
{
    auto fnd = time_unitstrings.find(unitString);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    std::string lcUstring =
        convertToLowerCase(string_viewOps::trim(unitString));
    fnd = time_unitstrings.find(lcUstring);
    if (fnd != time_unitstrings.end()) {
        return fnd->second;
    }
    throw(std::invalid_argument(
        std::string("unit ") + std::string(unitString) + " not recognized"));
}